

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

bool rcg::saveFile(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,string *data,
                  bool exception)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte in_CL;
  _Ios_Openmode in_ESI;
  ostringstream out;
  size_t n;
  size_t off;
  FileProtocolAdapter rf;
  bool ret;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  allocator local_241;
  string local_240 [32];
  string local_220 [39];
  undefined1 local_1f9;
  string local_1f8 [32];
  ostringstream local_1d8 [376];
  unsigned_long local_60 [3];
  ulong local_48;
  FileProtocolAdapter local_30 [22];
  byte local_1a;
  byte local_19;
  _Ios_Openmode local_10;
  
  local_19 = in_CL & 1;
  local_1a = 1;
  local_10 = in_ESI;
  GenApi_3_4::FileProtocolAdapter::FileProtocolAdapter(local_30);
  std::__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x135561);
  GenApi_3_4::FileProtocolAdapter::attach((INodeMap *)local_30);
  bVar1 = GenApi_3_4::FileProtocolAdapter::openFile((char *)local_30,local_10);
  if ((bVar1 & 1) == 0) {
    if ((local_19 & 1) != 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,"Cannot open file for writing: ",&local_241);
      std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
      std::invalid_argument::invalid_argument((invalid_argument *)__lhs,local_220);
      __cxa_throw(__lhs,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_1a = 0;
  }
  else {
    local_48 = 0;
    local_60[2] = 0x200;
    while (local_60[2] != 0) {
      lVar2 = std::__cxx11::string::c_str();
      uVar7 = local_48;
      lVar2 = lVar2 + local_48;
      local_60[1] = 0x200;
      lVar3 = std::__cxx11::string::size();
      local_60[0] = lVar3 - local_48;
      puVar4 = std::min<unsigned_long>(local_60 + 1,local_60);
      local_60[2] = GenApi_3_4::FileProtocolAdapter::write
                              ((char *)local_30,lVar2,uVar7,(char *)*puVar4);
      local_48 = local_60[2] + local_48;
    }
    GenApi_3_4::FileProtocolAdapter::closeFile((char *)local_30);
    uVar7 = local_48;
    uVar5 = std::__cxx11::string::size();
    if (uVar7 != uVar5) {
      if ((local_19 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1d8);
        poVar6 = std::operator<<((ostream *)local_1d8,"Error: Can only write ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_48);
        poVar6 = std::operator<<(poVar6," of ");
        uVar7 = std::__cxx11::string::size();
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar7);
        std::operator<<(poVar6," bytes");
        local_1f9 = 1;
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        std::invalid_argument::invalid_argument(this,local_1f8);
        local_1f9 = 0;
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      local_1a = 0;
    }
  }
  GenApi_3_4::FileProtocolAdapter::~FileProtocolAdapter(local_30);
  return (bool)(local_1a & 1);
}

Assistant:

bool saveFile(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  const std::string &data, bool exception)
{
  bool ret=true;

  // store in pieces of 512 bytes

  GenApi::FileProtocolAdapter rf;
  rf.attach(nodemap->_Ptr);

  if (rf.openFile(name, std::ios::out))
  {
    size_t off=0, n=512;
    while (n > 0)
    {
      n=rf.write(data.c_str()+off, off, std::min(static_cast<size_t>(512), data.size()-off), name);
      off+=n;
    }

    rf.closeFile(name);

    if (off != data.size())
    {
      if (exception)
      {
        std::ostringstream out;
        out << "Error: Can only write " << off << " of " << data.size() << " bytes";
        throw std::invalid_argument(out.str());
      }

      ret=false;
    }
  }
  else
  {
    if (exception)
    {
      throw std::invalid_argument(std::string("Cannot open file for writing: ")+name);
    }

    ret=false;
  }

  return ret;
}